

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O0

void __thiscall Omega_h::Comm::Comm(Comm *this,Library *library_in,bool is_graph,bool sends_to_self)

{
  initializer_list<int> l;
  Read<int> local_138;
  HostRead<int> local_128;
  Read<int> local_118;
  HostRead<int> local_108;
  allocator local_f1;
  string local_f0 [32];
  initializer_list<int> local_d0;
  Read<int> local_c0;
  allocator local_a9;
  string local_a8 [36];
  int local_84;
  iterator local_80;
  size_type local_78;
  Read<int> local_70 [2];
  byte local_4a;
  byte local_49;
  bool sends_to_self_local;
  Library *pLStack_48;
  bool is_graph_local;
  Library *library_in_local;
  Comm *this_local;
  Read<int> *local_30;
  Read<int> *local_28;
  Read<int> *local_20;
  Read<int> *local_18;
  Read<int> *local_10;
  
  this->library_ = library_in;
  this_local = (Comm *)&this->srcs_;
  (((Read<int> *)this_local)->write_).shared_alloc_.alloc = (Alloc *)0x0;
  (this->srcs_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_30 = &this->dsts_;
  (local_30->write_).shared_alloc_.alloc = (Alloc *)0x0;
  (this->dsts_).write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_4a = sends_to_self;
  local_49 = is_graph;
  pLStack_48 = library_in;
  library_in_local = (Library *)this;
  local_28 = local_30;
  local_20 = (Read<int> *)this_local;
  local_18 = (Read<int> *)this_local;
  local_10 = local_30;
  HostRead<int>::HostRead(&this->host_srcs_);
  HostRead<int>::HostRead(&this->host_dsts_);
  if ((local_49 & 1) == 0) {
    if ((local_4a & 1) != 0) {
      fail("assertion %s failed at %s +%d\n","!sends_to_self",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_comm.cpp"
           ,0x3f);
    }
  }
  else {
    if ((local_4a & 1) == 0) {
      std::initializer_list<int>::initializer_list(&local_d0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"",&local_f1);
      Read<int>::Read(&local_c0,local_d0,(string *)local_f0);
      Read<int>::operator=(&this->srcs_,&local_c0);
      Read<int>::~Read(&local_c0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      this->self_dst_ = -1;
      this->self_src_ = -1;
    }
    else {
      local_84 = 0;
      local_80 = &local_84;
      local_78 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"",&local_a9);
      l._M_len = local_78;
      l._M_array = local_80;
      Read<int>::Read(local_70,l,(string *)local_a8);
      Read<int>::operator=(&this->srcs_,local_70);
      Read<int>::~Read(local_70);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      this->self_dst_ = 0;
      this->self_src_ = 0;
    }
    Read<int>::operator=(&this->dsts_,&this->srcs_);
    Read<int>::Read(&local_118,&this->srcs_);
    HostRead<int>::HostRead(&local_108,(Read<signed_char> *)&local_118);
    HostRead<int>::operator=(&this->host_srcs_,&local_108);
    HostRead<int>::~HostRead(&local_108);
    Read<int>::~Read(&local_118);
    Read<int>::Read(&local_138,&this->dsts_);
    HostRead<int>::HostRead(&local_128,(Read<signed_char> *)&local_138);
    HostRead<int>::operator=(&this->host_dsts_,&local_128);
    HostRead<int>::~HostRead(&local_128);
    Read<int>::~Read(&local_138);
  }
  return;
}

Assistant:

Comm::Comm(Library* library_in, bool is_graph, bool sends_to_self)
    : library_(library_in) {
  if (is_graph) {
    if (sends_to_self) {
      srcs_ = Read<LO>({0});
      self_src_ = self_dst_ = 0;
    } else {
      srcs_ = Read<LO>({});
      self_src_ = self_dst_ = -1;
    }
    dsts_ = srcs_;
    host_srcs_ = HostRead<I32>(srcs_);
    host_dsts_ = HostRead<I32>(dsts_);
  } else {
    OMEGA_H_CHECK(!sends_to_self);
  }
}